

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int decompression_cleanup(archive_read *a)

{
  void *pvVar1;
  int iVar2;
  int local_1c;
  int r;
  xar *xar;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  local_1c = 0;
  if ((*(int *)((long)pvVar1 + 0xd8) != 0) && (iVar2 = inflateEnd((long)pvVar1 + 0x68), iVar2 != 0))
  {
    archive_set_error(&a->archive,-1,"Failed to clean up zlib decompressor");
    local_1c = -0x1e;
  }
  if (*(int *)((long)pvVar1 + 0x168) != 0) {
    lzma_end((long)pvVar1 + 0xe0);
  }
  return local_1c;
}

Assistant:

static int
decompression_cleanup(struct archive_read *a)
{
	struct xar *xar;
	int r;

	xar = (struct xar *)(a->format->data);
	r = ARCHIVE_OK;
	if (xar->stream_valid) {
		if (inflateEnd(&(xar->stream)) != Z_OK) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Failed to clean up zlib decompressor");
			r = ARCHIVE_FATAL;
		}
	}
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
	if (xar->bzstream_valid) {
		if (BZ2_bzDecompressEnd(&(xar->bzstream)) != BZ_OK) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Failed to clean up bzip2 decompressor");
			r = ARCHIVE_FATAL;
		}
	}
#endif
#if defined(HAVE_LZMA_H) && defined(HAVE_LIBLZMA)
	if (xar->lzstream_valid)
		lzma_end(&(xar->lzstream));
#endif
	return (r);
}